

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskWriteCase::init
          (SampleMaskWriteCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  undefined1 local_190 [384];
  
  iVar2 = *(int *)&(this->super_SampleMaskBaseCase).field_0x12c;
  if (iVar2 == 1) {
    local_190._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Discarding half of the samples using GL_SAMPLE_MASK, setting inverse mask in fragment shader using gl_SampleMask, expecting:\n"
               ,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t1) full discard on multisample targets (mask & modifiedCoverge == 0)\n",0x46);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t2) full intensity (no discard) on singlesample targets. (Mask and coverage is only applied as a multisample operation.)\n"
               ,0x79);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (iVar2 != 0) goto LAB_0040ec42;
    local_190._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Discarding half of the samples using gl_SampleMask, expecting:\n",
               0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t1) half intensity on multisample targets (numSamples > 1)\n",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t2) full discard on multisample targets (numSamples == 1)\n",0x3a
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t3) full intensity (no discard) on singlesample targets. (Mask is only applied as a multisample operation.)\n"
               ,0x6c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  ctx = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
LAB_0040ec42:
  iVar2 = SampleMaskBaseCase::init(&this->super_SampleMaskBaseCase,ctx);
  return iVar2;
}

Assistant:

void SampleMaskWriteCase::init (void)
{
	// log the test method and expectations
	if (m_testMode == TEST_DISCARD)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Discarding half of the samples using gl_SampleMask, expecting:\n"
			<< "	1) half intensity on multisample targets (numSamples > 1)\n"
			<< "	2) full discard on multisample targets (numSamples == 1)\n"
			<< "	3) full intensity (no discard) on singlesample targets. (Mask is only applied as a multisample operation.)\n"
			<< tcu::TestLog::EndMessage;
	else if (m_testMode == TEST_INVERSE)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Discarding half of the samples using GL_SAMPLE_MASK, setting inverse mask in fragment shader using gl_SampleMask, expecting:\n"
			<< "	1) full discard on multisample targets (mask & modifiedCoverge == 0)\n"
			<< "	2) full intensity (no discard) on singlesample targets. (Mask and coverage is only applied as a multisample operation.)\n"
			<< tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	SampleMaskBaseCase::init();
}